

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

void Acb_NtkFindSupp_rec(Acb_Ntk_t *p,int iObj,Vec_Int_t *vSupp)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  
  iVar1 = Acb_ObjSetTravIdCur(p,iObj);
  if (iVar1 == 0) {
    iVar1 = Acb_ObjIsCi(p,iObj);
    if (iVar1 != 0) {
      piVar2 = Acb_ObjFanins(p,iObj);
      Vec_IntPush(vSupp,piVar2[2]);
      return;
    }
    piVar2 = Acb_ObjFanins(p,iObj);
    for (lVar3 = 0; lVar3 < *piVar2; lVar3 = lVar3 + 1) {
      Acb_NtkFindSupp_rec(p,piVar2[lVar3 + 1],vSupp);
    }
  }
  return;
}

Assistant:

void Acb_NtkFindSupp_rec( Acb_Ntk_t * p, int iObj, Vec_Int_t * vSupp )
{
    int * pFanin, iFanin, i;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( Acb_ObjIsCi(p, iObj) )
        Vec_IntPush( vSupp, Acb_ObjCioId(p, iObj) );
    else
        Acb_ObjForEachFaninFast( p, iObj, pFanin, iFanin, i )
            Acb_NtkFindSupp_rec( p, iFanin, vSupp );
}